

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

string * flatbuffers::NumToString<unsigned_int>(string *__return_storage_ptr__,uint t)

{
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [380];
  uint local_14;
  string *psStack_10;
  uint t_local;
  
  local_14 = t;
  psStack_10 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::ostream::operator<<(local_190,local_14);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string NumToString(T t) {
  // clang-format off

  #ifndef FLATBUFFERS_PREFER_PRINTF
    std::stringstream ss;
    ss << t;
    return ss.str();
  #else // FLATBUFFERS_PREFER_PRINTF
    auto v = static_cast<long long>(t);
    return NumToStringImplWrapper(v, "%.*lld");
  #endif // FLATBUFFERS_PREFER_PRINTF
  // clang-format on
}